

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::Array2D
          (Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *this,long sizeX,long sizeY)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  Array2D<Imath_3_2::half> *pAVar5;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong uVar6;
  Array2D<Imath_3_2::half> *local_58;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  uVar2 = in_RSI * in_RDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pAVar5 = (Array2D<Imath_3_2::half> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_58 = pAVar5;
    do {
      Array2D<Imath_3_2::half>::Array2D(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != pAVar5 + uVar2);
  }
  in_RDI[2] = (long)pAVar5;
  return;
}

Assistant:

inline Array2D<T>::Array2D (long sizeX, long sizeY)
    : _sizeX (sizeX), _sizeY (sizeY), _data (new T[sizeX * sizeY])
{
    // empty
}